

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O0

void CB_ADF::global_print_newline(vw *all)

{
  size_t sVar1;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  ostream *this;
  long in_RDI;
  ssize_t t;
  int f;
  size_t i;
  char temp [1];
  ostream *in_stack_ffffffffffffffc8;
  size_t sVar5;
  size_t local_18;
  
  local_18 = 0;
  while( true ) {
    sVar5 = local_18;
    sVar1 = v_array<int>::size((v_array<int> *)(in_RDI + 0x3510));
    if (sVar1 <= sVar5) break;
    v_array<int>::operator[]((v_array<int> *)(in_RDI + 0x3510),local_18);
    sVar2 = io_buf::write_file_or_socket((int)(sVar5 >> 0x20),in_stack_ffffffffffffffc8,0x3a7a02);
    if (sVar2 != 1) {
      in_stack_ffffffffffffffc8 = std::operator<<((ostream *)&std::cerr,"write error: ");
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      this = std::operator<<(in_stack_ffffffffffffffc8,pcVar4);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void global_print_newline(vw& all)
{
  char temp[1];
  temp[0] = '\n';
  for (size_t i = 0; i < all.final_prediction_sink.size(); i++)
  {
    int f = all.final_prediction_sink[i];
    ssize_t t;
    t = io_buf::write_file_or_socket(f, temp, 1);
    if (t != 1)
      cerr << "write error: " << strerror(errno) << endl;
  }
}